

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O1

void __thiscall
pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
          (transaction<std::unique_lock<mock_mutex>_> *this,database *db,lock_type *lock)

{
  transaction_base::transaction_base(&this->super_transaction_base,db);
  (this->super_transaction_base)._vptr_transaction_base = (_func_int **)&PTR__transaction_001f1ab0;
  (this->lock_)._M_device = lock->_M_device;
  (this->lock_)._M_owns = lock->_M_owns;
  lock->_M_device = (mutex_type *)0x0;
  lock->_M_owns = false;
  if ((this->super_transaction_base).first_.a_ == 0) {
    return;
  }
  assert_failed("!this->is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/transaction.hpp"
                ,0xd7);
}

Assistant:

transaction<LockGuard>::transaction (database & db, LockGuard && lock)
            : transaction_base (db)
            , lock_{std::move (lock)} {

        PSTORE_ASSERT (!this->is_open ());
    }